

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O3

QString * __thiscall
QXcbScreen::getOutputName
          (QString *__return_storage_ptr__,QXcbScreen *this,
          xcb_randr_get_output_info_reply_t *outputInfo)

{
  uint uVar1;
  char *__s;
  storage_type *psVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (outputInfo == (xcb_randr_get_output_info_reply_t *)0x0) {
    defaultName(&local_38,this);
    *(undefined4 *)&(__return_storage_ptr__->d).d = local_38.d.d._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_38.d.d._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_38.d.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_38.d.ptr._4_4_;
  }
  else {
    __s = (char *)xcb_randr_get_output_info_name(outputInfo);
    uVar1 = xcb_randr_get_output_info_name_length(outputInfo);
    psVar2 = (storage_type *)0x0;
    if (0 < (int)uVar1) {
      psVar2 = (storage_type *)(ulong)uVar1;
    }
    if (__s == (char *)0x0) {
      psVar2 = (storage_type *)0x0;
    }
    if (__s != (char *)0x0 && (int)uVar1 < 0) {
      psVar2 = (storage_type *)strlen(__s);
    }
    QVar3.m_data = psVar2;
    QVar3.m_size = (qsizetype)&local_38;
    QString::fromUtf8(QVar3);
    *(undefined4 *)&(__return_storage_ptr__->d).d = local_38.d.d._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_38.d.d._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_38.d.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_38.d.ptr._4_4_;
  }
  (__return_storage_ptr__->d).size = local_38.d.size;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QXcbScreen::getOutputName(xcb_randr_get_output_info_reply_t *outputInfo)
{
    QString name;
    if (outputInfo) {
        name = QString::fromUtf8((const char*)xcb_randr_get_output_info_name(outputInfo),
                                 xcb_randr_get_output_info_name_length(outputInfo));
    } else {
        name = defaultName();
    }
    return name;
}